

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O2

bool __thiscall solitaire::Solitaire::isGameFinished(Solitaire *this)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0x20;
  while( true ) {
    if (lVar2 == 0x60) {
      return true;
    }
    uVar1 = (**(code **)(**(long **)((long)((this->foundationPiles)._M_elems + -2) + lVar2) + 0x38))
                      ();
    if ((uVar1 & 0x1ffffffff) != 0x10000000c) break;
    uVar1 = (**(code **)(**(long **)((long)((this->foundationPiles)._M_elems + -1) + lVar2) + 0x38))
                      ();
    if ((uVar1 & 0x1ffffffff) != 0x10000000c) {
      lVar2 = lVar2 + 0x10;
      break;
    }
    uVar1 = (**(code **)(**(long **)((long)&(this->foundationPiles)._M_elems[0].
                                            super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar2) + 0x38))();
    if ((uVar1 & 0x1ffffffff) != 0x10000000c) {
      lVar2 = lVar2 + 0x20;
      break;
    }
    uVar1 = (**(code **)(**(long **)((long)&(this->foundationPiles)._M_elems[1].
                                            super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar2) + 0x38))();
    if ((uVar1 & 0x1ffffffff) != 0x10000000c) {
      lVar2 = lVar2 + 0x30;
      break;
    }
    lVar2 = lVar2 + 0x40;
  }
  return lVar2 == 0x60;
}

Assistant:

bool Solitaire::isGameFinished() const {
    return std::all_of(foundationPiles.begin(), foundationPiles.end(),
        [](const auto& pile) {
            return pile->getTopCardValue() == Value::King;
        }
    );
}